

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O2

Ch __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::PercentDecodeStream::Take(PercentDecodeStream *this)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char cVar4;
  char cVar5;
  bool bVar6;
  
  pcVar2 = this->src_;
  if ((*pcVar2 == '%') && (pcVar2 + 3 <= this->end_)) {
    this->src_ = pcVar2 + 1;
    pcVar2 = pcVar2 + 2;
    iVar3 = 2;
    cVar4 = '\0';
    while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
      cVar1 = pcVar2[-1];
      cVar5 = -0x30;
      if (((9 < (byte)(cVar1 - 0x30U)) && (cVar5 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
         (cVar5 = -0x57, 5 < (byte)(cVar1 + 0x9fU))) goto LAB_00107621;
      cVar4 = cVar1 + cVar4 * '\x10' + cVar5;
      this->src_ = pcVar2;
      pcVar2 = pcVar2 + 1;
    }
  }
  else {
LAB_00107621:
    this->valid_ = false;
    cVar4 = '\0';
  }
  return cVar4;
}

Assistant:

Ch Take() {
            if (*src_ != '%' || src_ + 3 > end_) { // %XY triplet
                valid_ = false;
                return 0;
            }
            src_++;
            Ch c = 0;
            for (int j = 0; j < 2; j++) {
                c = static_cast<Ch>(c << 4);
                Ch h = *src_;
                if      (h >= '0' && h <= '9') c = static_cast<Ch>(c + h - '0');
                else if (h >= 'A' && h <= 'F') c = static_cast<Ch>(c + h - 'A' + 10);
                else if (h >= 'a' && h <= 'f') c = static_cast<Ch>(c + h - 'a' + 10);
                else {
                    valid_ = false;
                    return 0;
                }
                src_++;
            }
            return c;
        }